

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
Vector3<ExactFloat>::Vector3(Vector3<ExactFloat> *this,ExactFloat *x,ExactFloat *y,ExactFloat *z)

{
  BIGNUM *pBVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->c_[0].sign_ + lVar2) = 0x7ffffffd00000001;
    pBVar1 = BN_new();
    *(BIGNUM **)((long)&this->c_[0].bn_.bn_ + lVar2) = pBVar1;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x30);
  ExactFloat::operator=(this->c_,x);
  ExactFloat::operator=(this->c_ + 1,y);
  ExactFloat::operator=(this->c_ + 2,z);
  return;
}

Assistant:

Vector3(T x, T y, T z) {
    c_[0] = x;
    c_[1] = y;
    c_[2] = z;
  }